

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient-hostkey-cache.c
# Opt level: O0

_Bool ssh_transient_hostkey_cache_verify(ssh_transient_hostkey_cache *thc,ssh_key *key)

{
  tree234 *t;
  int iVar1;
  ssh_keyalg *e;
  void *pvVar2;
  strbuf *buf_o;
  strbuf *this_blob;
  _Bool toret;
  ssh_transient_hostkey_cache_entry *ent;
  ssh_key *key_local;
  ssh_transient_hostkey_cache *thc_local;
  
  this_blob._7_1_ = false;
  t = thc->cache;
  e = ssh_key_alg(key);
  pvVar2 = find234(t,e,ssh_transient_hostkey_cache_find);
  if (pvVar2 != (void *)0x0) {
    buf_o = strbuf_new();
    ssh_key_public_blob(key,buf_o->binarysink_);
    if (buf_o->len == *(size_t *)(*(long *)((long)pvVar2 + 8) + 0x10)) {
      iVar1 = memcmp(buf_o->s,(void *)**(undefined8 **)((long)pvVar2 + 8),buf_o->len);
      if (iVar1 == 0) {
        this_blob._7_1_ = true;
      }
    }
    strbuf_free(buf_o);
  }
  return this_blob._7_1_;
}

Assistant:

bool ssh_transient_hostkey_cache_verify(
    ssh_transient_hostkey_cache *thc, ssh_key *key)
{
    struct ssh_transient_hostkey_cache_entry *ent;
    bool toret = false;

    if ((ent = find234(thc->cache, (void *)ssh_key_alg(key),
                       ssh_transient_hostkey_cache_find)) != NULL) {
        strbuf *this_blob = strbuf_new();
        ssh_key_public_blob(key, BinarySink_UPCAST(this_blob));

        if (this_blob->len == ent->pub_blob->len &&
            !memcmp(this_blob->s, ent->pub_blob->s,
                    this_blob->len))
            toret = true;

        strbuf_free(this_blob);
    }

    return toret;
}